

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetSpectrumForEstimation
               (double *x,int x_length,int y_length,double actual_fs,int fft_size,
               int decimation_ratio,fft_complex *y_spectrum)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  int iVar7;
  ulong uVar8;
  void *pvVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int i_5;
  double tmp;
  fft_complex *filter_spectrum;
  int cutoff_in_sample;
  fft_plan forwardFFT;
  int i_4;
  int i_3;
  int i_2;
  double mean_y;
  int i_1;
  int i;
  double *y;
  undefined8 in_stack_fffffffffffffe18;
  fft_complex *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  int fft_size_00;
  int N;
  double *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  double *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  double *in_stack_fffffffffffffe70;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  int local_144;
  undefined1 local_138 [40];
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  double *local_b0;
  undefined8 uStack_a8;
  undefined1 local_98 [32];
  void *local_78;
  int local_4c;
  int local_48;
  int local_44;
  double local_40;
  int local_38;
  int local_34;
  void *local_30;
  long local_28;
  int local_20;
  int local_1c;
  double local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_18 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)in_ECX;
  uVar8 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_30 = operator_new__(uVar8);
  for (local_34 = 0; local_34 < local_1c; local_34 = local_34 + 1) {
    *(undefined8 *)((long)local_30 + (long)local_34 * 8) = 0;
  }
  if (local_20 == 1) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      *(undefined8 *)((long)local_30 + (long)local_38 * 8) =
           *(undefined8 *)(local_8 + (long)local_38 * 8);
    }
  }
  else {
    decimate(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
  }
  local_40 = 0.0;
  for (local_44 = 0; local_44 < local_10; local_44 = local_44 + 1) {
    local_40 = *(double *)((long)local_30 + (long)local_44 * 8) + local_40;
  }
  local_40 = local_40 / (double)local_10;
  for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
    *(double *)((long)local_30 + (long)local_48 * 8) =
         *(double *)((long)local_30 + (long)local_48 * 8) - local_40;
  }
  for (local_4c = local_10; local_4c < local_1c; local_4c = local_4c + 1) {
    *(undefined8 *)((long)local_30 + (long)local_4c * 8) = 0;
  }
  fft_plan_dft_r2c_1d(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  memcpy(&stack0xffffffffffffff20,local_98,0x48);
  fft_size_00 = (int)uStack_a8;
  N = (int)((ulong)uStack_a8 >> 0x20);
  p_00._8_8_ = in_stack_fffffffffffffef8;
  p_00.n = (int)in_stack_fffffffffffffef0;
  p_00.sign = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffff00;
  p_00.in = (double *)in_stack_ffffffffffffff08;
  p_00.c_out = (fft_complex *)in_stack_ffffffffffffff10;
  p_00.out._0_4_ = in_stack_ffffffffffffff18;
  p_00.out._4_4_ = in_stack_ffffffffffffff1c;
  p_00.input = (double *)in_stack_ffffffffffffff20;
  p_00.ip = (int *)in_stack_ffffffffffffff28;
  p_00.w = in_stack_ffffffffffffff30;
  fft_execute(p_00);
  iVar7 = matlab_round(local_18 / 50.0);
  DesignLowCutFilter(N,fft_size_00,local_b0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)local_1c;
  uVar8 = SUB168(auVar6 * ZEXT816(0x10),0);
  if (SUB168(auVar6 * ZEXT816(0x10),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  local_78 = pvVar9;
  memcpy(local_138,local_98,0x48);
  p_01._8_8_ = in_stack_fffffffffffffef8;
  p_01.n = (int)in_stack_fffffffffffffef0;
  p_01.sign = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  p_01.c_in = (fft_complex *)in_stack_ffffffffffffff00;
  p_01.in = (double *)in_stack_ffffffffffffff08;
  p_01.c_out = (fft_complex *)pvVar9;
  p_01.out._0_4_ = in_stack_ffffffffffffff18;
  p_01.out._4_4_ = iVar7;
  p_01.input = (double *)in_stack_ffffffffffffff20;
  p_01.ip = (int *)in_stack_ffffffffffffff28;
  p_01.w = in_stack_ffffffffffffff30;
  fft_execute(p_01);
  for (local_144 = 0; local_144 <= local_1c / 2; local_144 = local_144 + 1) {
    dVar1 = *(double *)(local_28 + (long)local_144 * 0x10);
    dVar2 = *(double *)((long)pvVar9 + (long)local_144 * 0x10);
    dVar3 = *(double *)(local_28 + (long)local_144 * 0x10 + 8);
    dVar4 = *(double *)((long)pvVar9 + (long)local_144 * 0x10 + 8);
    *(double *)(local_28 + (long)local_144 * 0x10 + 8) =
         *(double *)(local_28 + (long)local_144 * 0x10) *
         *(double *)((long)pvVar9 + (long)local_144 * 0x10 + 8) +
         *(double *)(local_28 + (long)local_144 * 0x10 + 8) *
         *(double *)((long)pvVar9 + (long)local_144 * 0x10);
    *(double *)(local_28 + (long)local_144 * 0x10) = dVar1 * dVar2 + -(dVar3 * dVar4);
  }
  memcpy(&stack0xfffffffffffffe70,local_98,0x48);
  p._8_8_ = local_160;
  p._0_8_ = uStack_168;
  p.c_in._0_4_ = (int)uStack_158;
  p.c_in._4_4_ = (int)((ulong)uStack_158 >> 0x20);
  p.in = (double *)local_150;
  p.c_out = (fft_complex *)in_stack_fffffffffffffe50;
  p.out._0_4_ = in_stack_fffffffffffffe58;
  p.out._4_4_ = in_stack_fffffffffffffe5c;
  p.input = in_stack_fffffffffffffe60;
  p.ip._0_4_ = in_stack_fffffffffffffe68;
  p.ip._4_4_ = local_144;
  p.w = in_stack_fffffffffffffe70;
  fft_destroy_plan(p);
  if (local_30 != (void *)0x0) {
    operator_delete__(local_30);
  }
  if (pvVar9 != (void *)0x0) {
    operator_delete__(pvVar9);
  }
  return;
}

Assistant:

static void GetSpectrumForEstimation(const double *x, int x_length,
    int y_length, double actual_fs, int fft_size, int decimation_ratio,
    fft_complex *y_spectrum) {
  double *y = new double[fft_size];

  // Initialization
  for (int i = 0; i < fft_size; ++i) y[i] = 0.0;

  // Downsampling
  if (decimation_ratio != 1)
    decimate(x, x_length, decimation_ratio, y);
  else
    for (int i = 0; i < x_length; ++i) y[i] = x[i];

  // Removal of the DC component (y = y - mean value of y)
  double mean_y = 0.0;
  for (int i = 0; i < y_length; ++i) mean_y += y[i];
  mean_y /= y_length;
  for (int i = 0; i < y_length; ++i) y[i] -= mean_y;
  for (int i = y_length; i < fft_size; ++i) y[i] = 0.0;

  fft_plan forwardFFT =
    fft_plan_dft_r2c_1d(fft_size, y, y_spectrum, FFT_ESTIMATE);
  fft_execute(forwardFFT);

  // Low cut filtering (from 0.1.4). Cut off frequency is 50.0 Hz.
  int cutoff_in_sample = matlab_round(actual_fs / world::kCutOff);
  DesignLowCutFilter(cutoff_in_sample * 2 + 1, fft_size, y);

  fft_complex *filter_spectrum = new fft_complex[fft_size];
  forwardFFT.c_out = filter_spectrum;
  fft_execute(forwardFFT);

  double tmp = 0;
  for (int i = 0; i <= fft_size / 2; ++i) {
    // Complex number multiplications.
    tmp = y_spectrum[i][0] * filter_spectrum[i][0] -
      y_spectrum[i][1] * filter_spectrum[i][1];
    y_spectrum[i][1] = y_spectrum[i][0] * filter_spectrum[i][1] +
      y_spectrum[i][1] * filter_spectrum[i][0];
    y_spectrum[i][0] = tmp;
  }

  fft_destroy_plan(forwardFFT);
  delete[] y;
  delete[] filter_spectrum;
}